

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void fmt::v8::detail::vformat_to<char>
               (buffer<char> *buf,basic_string_view<char> fmt,
               basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> args,
               locale_ref loc)

{
  short *pend;
  appender out;
  code *pcVar1;
  undefined1 value [16];
  undefined1 value_00 [16];
  short *end;
  short *psVar2;
  short *pbegin;
  size_t sVar3;
  type tVar4;
  size_t __n;
  appender it;
  ulong uVar5;
  float value_01;
  basic_format_specs<char> specs;
  writer write;
  undefined8 in_stack_ffffffffffffff48;
  undefined2 in_stack_ffffffffffffff50;
  undefined6 in_stack_ffffffffffffff52;
  default_arg_formatter<char> local_a8;
  undefined1 local_88 [32];
  appender local_68;
  char *local_60;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  local_58;
  locale_ref local_50;
  undefined1 local_48 [16];
  undefined4 local_38;
  
  local_a8.args.field_1 = args.field_1;
  local_a8.args.desc_ = args.desc_;
  local_88._16_8_ = fmt.size_;
  pbegin = (short *)fmt.data_;
  if ((local_88._16_8_ == 2) && (*pbegin == 0x7d7b)) {
    if ((long)local_a8.args.desc_ < 0) {
      if (((int)(type)args.desc_ < 1) ||
         (tVar4 = (local_a8.args.field_1.args_)->type_, tVar4 == none_type)) goto LAB_0010f1a3;
    }
    else {
      tVar4 = (type)args.desc_ & custom_type;
      if (((undefined1  [16])args & (undefined1  [16])0xf) == (undefined1  [16])0x0) {
LAB_0010f1a3:
        throw_format_error("argument not found");
      }
    }
    out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container =
         *(back_insert_iterator<fmt::v8::detail::buffer<char>_> *)
          &(local_a8.args.field_1.values_)->field_0;
    pcVar1 = *(code **)((long)&(local_a8.args.field_1.values_)->field_0 + 8);
    value_01 = out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container._0_4_;
    local_a8.out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container =
         (back_insert_iterator<fmt::v8::detail::buffer<char>_>)
         (back_insert_iterator<fmt::v8::detail::buffer<char>_>)buf;
    local_a8.loc.locale_ = loc.locale_;
    switch(tVar4) {
    case int_type:
      write<char,_fmt::v8::appender,_int,_0>((appender)buf,(int)value_01);
      break;
    case uint_type:
      write<char,_fmt::v8::appender,_unsigned_int,_0>((appender)buf,(uint)value_01);
      break;
    case long_long_type:
      write<char,_fmt::v8::appender,_long_long,_0>
                ((appender)buf,
                 (longlong)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container)
      ;
      break;
    case ulong_long_type:
      write<char,_fmt::v8::appender,_unsigned_long_long,_0>
                ((appender)buf,
                 (unsigned_long_long)
                 out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
      break;
    case int128_type:
      value._8_2_ = in_stack_ffffffffffffff50;
      value._0_8_ = in_stack_ffffffffffffff48;
      value._10_6_ = in_stack_ffffffffffffff52;
      write<char,_fmt::v8::appender,___int128,_0>((detail *)buf,out,(__int128)value);
      break;
    case uint128_type:
      value_00._8_2_ = in_stack_ffffffffffffff50;
      value_00._0_8_ = in_stack_ffffffffffffff48;
      value_00._10_6_ = in_stack_ffffffffffffff52;
      write<char,_fmt::v8::appender,_unsigned___int128,_0>
                ((detail *)buf,out,(unsigned___int128)value_00);
      break;
    case bool_type:
      default_arg_formatter<char>::operator()
                (&local_a8,
                 (bool)((byte)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                              container & 1));
      break;
    case char_type:
      sVar3 = buf->size_;
      uVar5 = sVar3 + 1;
      if (buf->capacity_ < uVar5) {
        (**buf->_vptr_buffer)(buf);
        sVar3 = buf->size_;
        uVar5 = sVar3 + 1;
      }
      buf->size_ = uVar5;
      buf->ptr_[sVar3] =
           (byte)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
      break;
    case float_type:
      write<char,_fmt::v8::appender,_float,_0>((appender)buf,value_01);
      break;
    case double_type:
      write<char,_fmt::v8::appender,_double,_0>
                ((appender)buf,
                 (double)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
      break;
    case last_numeric_type:
      specs.type = none;
      specs._9_2_ = 0;
      specs.fill.data_[0] = ' ';
      specs.fill.data_[1] = '\0';
      specs.fill.data_[2] = '\0';
      specs.fill.data_[3] = '\0';
      specs.fill.size_ = '\x01';
      specs.width = 0;
      specs.precision = -1;
      write<char,_fmt::v8::appender,_long_double,_0>
                ((appender)buf,((local_a8.args.field_1.values_)->field_0).long_double_value,specs,
                 (locale_ref)0x0);
      break;
    case cstring_type:
      write<char,fmt::v8::appender>
                ((appender)buf,
                 (char *)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
      break;
    case string_type:
      copy_str_noinline<char,char_const*,fmt::v8::appender>
                ((char *)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container,
                 (char *)(pcVar1 + (long)out.
                                         super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                                         container),(appender)buf);
      break;
    case pointer_type:
      default_arg_formatter<char>::operator()
                (&local_a8,
                 (void *)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
      break;
    case custom_type:
      local_48 = (undefined1  [16])0x0;
      local_38 = 0;
      local_88._0_8_ = buf;
      local_88._8_8_ = local_a8.args.desc_;
      local_88._16_8_ = local_a8.args.field_1;
      local_88._24_8_ = loc.locale_;
      (*pcVar1)(out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
      break;
    default:
      assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format.h"
                  ,0x820,"");
    }
  }
  else {
    local_88._24_8_ = local_88._24_8_ & 0xffffffff00000000;
    pend = (short *)((long)pbegin + local_88._16_8_);
    local_88._8_8_ = pbegin;
    local_68.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container =
         (back_insert_iterator<fmt::v8::detail::buffer<char>_>)
         (back_insert_iterator<fmt::v8::detail::buffer<char>_>)buf;
    local_60 = (char *)local_a8.args.desc_;
    local_58 = local_a8.args.field_1;
    local_50.locale_ = loc.locale_;
    if ((long)local_88._16_8_ < 0x20) {
      if (local_88._16_8_ != 0) {
        psVar2 = pbegin;
        do {
          end = (short *)((long)psVar2 + 1);
          if ((char)*psVar2 == '}') {
            if ((end == pend) || (*(char *)end != '}')) {
              throw_format_error("unmatched \'}\' in format string");
            }
            vformat_to<char>::format_handler::on_text
                      ((format_handler *)local_88,(char *)pbegin,(char *)end);
            end = psVar2 + 1;
            pbegin = end;
          }
          else if ((char)*psVar2 == '{') {
            vformat_to<char>::format_handler::on_text
                      ((format_handler *)local_88,(char *)pbegin,(char *)psVar2);
            end = (short *)parse_replacement_field<char,fmt::v8::detail::vformat_to<char>(fmt::v8::detail::buffer<char>&,fmt::v8::basic_string_view<char>,fmt::v8::basic_format_args<fmt::v8::basic_format_context<std::conditional<std::is_same<fmt::v8::type_identity<char>::type,char>::value,fmt::v8::appender,std::back_insert_iterator<fmt::v8::detail::buffer<fmt::v8::type_identity<char>::type>>>::type,fmt::v8::type_identity<char>::type>>,fmt::v8::detail::locale_ref)::format_handler&>
                                     ((char *)psVar2,(char *)pend,(format_handler *)local_88);
            pbegin = end;
          }
          psVar2 = end;
        } while (end != pend);
      }
      vformat_to<char>::format_handler::on_text
                ((format_handler *)local_88,(char *)pbegin,(char *)pend);
    }
    else {
      local_a8.out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container =
           (back_insert_iterator<fmt::v8::detail::buffer<char>_>)
           (back_insert_iterator<fmt::v8::detail::buffer<char>_>)local_88;
      do {
        psVar2 = pbegin;
        if ((char)*pbegin != '{') {
          __n = (long)pend - ((long)pbegin + 1);
          if ((long)__n < 0) {
            assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/core.h"
                        ,0x195,"negative value");
          }
          psVar2 = (short *)memchr((void *)((long)pbegin + 1),0x7b,__n);
          if (psVar2 == (short *)0x0) {
            parse_format_string<false,_char,_format_handler>::writer::operator()
                      ((writer *)&local_a8,(char *)pbegin,(char *)pend);
            return;
          }
        }
        parse_format_string<false,_char,_format_handler>::writer::operator()
                  ((writer *)&local_a8,(char *)pbegin,(char *)psVar2);
        pbegin = (short *)parse_replacement_field<char,fmt::v8::detail::vformat_to<char>(fmt::v8::detail::buffer<char>&,fmt::v8::basic_string_view<char>,fmt::v8::basic_format_args<fmt::v8::basic_format_context<std::conditional<std::is_same<fmt::v8::type_identity<char>::type,char>::value,fmt::v8::appender,std::back_insert_iterator<fmt::v8::detail::buffer<fmt::v8::type_identity<char>::type>>>::type,fmt::v8::type_identity<char>::type>>,fmt::v8::detail::locale_ref)::format_handler&>
                                    ((char *)psVar2,(char *)pend,(format_handler *)local_88);
      } while (pbegin != pend);
    }
  }
  return;
}

Assistant:

void vformat_to(
    buffer<Char>& buf, basic_string_view<Char> fmt,
    basic_format_args<FMT_BUFFER_CONTEXT(type_identity_t<Char>)> args,
    locale_ref loc) {
  // workaround for msvc bug regarding name-lookup in module
  // link names into function scope
  using detail::arg_formatter;
  using detail::buffer_appender;
  using detail::custom_formatter;
  using detail::default_arg_formatter;
  using detail::get_arg;
  using detail::locale_ref;
  using detail::parse_format_specs;
  using detail::specs_checker;
  using detail::specs_handler;
  using detail::to_unsigned;
  using detail::type;
  using detail::write;
  auto out = buffer_appender<Char>(buf);
  if (fmt.size() == 2 && equal2(fmt.data(), "{}")) {
    auto arg = args.get(0);
    if (!arg) error_handler().on_error("argument not found");
    visit_format_arg(default_arg_formatter<Char>{out, args, loc}, arg);
    return;
  }

  struct format_handler : error_handler {
    basic_format_parse_context<Char> parse_context;
    buffer_context<Char> context;

    format_handler(buffer_appender<Char> out, basic_string_view<Char> str,
                   basic_format_args<buffer_context<Char>> args, locale_ref loc)
        : parse_context(str), context(out, args, loc) {}

    void on_text(const Char* begin, const Char* end) {
      auto text = basic_string_view<Char>(begin, to_unsigned(end - begin));
      context.advance_to(write<Char>(context.out(), text));
    }

    FMT_CONSTEXPR auto on_arg_id() -> int {
      return parse_context.next_arg_id();
    }
    FMT_CONSTEXPR auto on_arg_id(int id) -> int {
      return parse_context.check_arg_id(id), id;
    }
    FMT_CONSTEXPR auto on_arg_id(basic_string_view<Char> id) -> int {
      int arg_id = context.arg_id(id);
      if (arg_id < 0) on_error("argument not found");
      return arg_id;
    }

    FMT_INLINE void on_replacement_field(int id, const Char*) {
      auto arg = get_arg(context, id);
      context.advance_to(visit_format_arg(
          default_arg_formatter<Char>{context.out(), context.args(),
                                      context.locale()},
          arg));
    }

    auto on_format_specs(int id, const Char* begin, const Char* end)
        -> const Char* {
      auto arg = get_arg(context, id);
      if (arg.type() == type::custom_type) {
        parse_context.advance_to(parse_context.begin() +
                                 (begin - &*parse_context.begin()));
        visit_format_arg(custom_formatter<Char>{parse_context, context}, arg);
        return parse_context.begin();
      }
      auto specs = basic_format_specs<Char>();
      specs_checker<specs_handler<Char>> handler(
          specs_handler<Char>(specs, parse_context, context), arg.type());
      begin = parse_format_specs(begin, end, handler);
      if (begin == end || *begin != '}')
        on_error("missing '}' in format string");
      auto f = arg_formatter<Char>{context.out(), specs, context.locale()};
      context.advance_to(visit_format_arg(f, arg));
      return begin;
    }
  };
  detail::parse_format_string<false>(fmt, format_handler(out, fmt, args, loc));
}